

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::PrivateToLocalPass::IsValidUse(PrivateToLocalPass *this,Instruction *inst)

{
  Op opcode;
  IRContext *this_00;
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  CVar2 = Instruction::GetCommonDebugOpcode(inst);
  bVar1 = true;
  if (((CVar2 != CommonDebugInfoDebugGlobalVariable) &&
      (opcode = inst->opcode_, 2 < opcode - OpImageTexelPointer)) && (opcode != OpName)) {
    if (opcode != OpAccessChain) {
      bVar1 = spvOpcodeIsDecoration(opcode);
      return bVar1;
    }
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:169:17)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/private_to_local_pass.cpp:169:17)>
               ::_M_manager;
    local_40._M_unused._M_object = this;
    bVar1 = analysis::DefUseManager::WhileEachUser
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,inst,(function<bool_(spvtools::opt::Instruction_*)> *)&local_40)
    ;
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool PrivateToLocalPass::IsValidUse(const Instruction* inst) const {
  // The cases in this switch have to match the cases in |UpdateUse|.
  // If we don't know how to update it, it is not valid.
  if (inst->GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
    return true;
  }
  switch (inst->opcode()) {
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpImageTexelPointer:  // Treat like a load
      return true;
    case spv::Op::OpAccessChain:
      return context()->get_def_use_mgr()->WhileEachUser(
          inst, [this](const Instruction* user) {
            if (!IsValidUse(user)) return false;
            return true;
          });
    case spv::Op::OpName:
      return true;
    default:
      return spvOpcodeIsDecoration(inst->opcode());
  }
}